

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomenv.cpp
# Opt level: O0

void anon_unknown.dwarf_168191::AddAllCPUID(CSHA512 *hasher)

{
  long lVar1;
  long in_FS_OFFSET;
  uint32_t leaf_1;
  uint32_t ext_max;
  uint32_t subleaf;
  uint32_t maxsub;
  uint32_t leaf;
  uint32_t max;
  uint32_t dx;
  uint32_t cx;
  uint32_t bx;
  uint32_t ax;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar2;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar4;
  uint in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint32_t in_stack_ffffffffffffffd8;
  uint subleaf_00;
  uint32_t in_stack_ffffffffffffffdc;
  uint local_18;
  uint local_14;
  int in_stack_fffffffffffffff0;
  uint in_stack_fffffffffffffff4;
  uint uVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AddCPUID((CSHA512 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
           in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
           (uint32_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
           (uint32_t *)
           CONCAT17(in_stack_ffffffffffffffc7,
                    CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),&local_18,
           (uint32_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  subleaf_00 = 1;
  uVar4 = in_stack_fffffffffffffff4;
LAB_00214add:
  uVar2 = subleaf_00 <= in_stack_fffffffffffffff4 && subleaf_00 < 0x100;
  if (subleaf_00 > in_stack_fffffffffffffff4 || subleaf_00 >= 0x100) {
    AddCPUID((CSHA512 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_fffffffffffffff4,subleaf_00,
             (uint32_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (uint32_t *)
             CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),&local_18
             ,(uint32_t *)CONCAT44(uVar4,in_stack_fffffffffffffff0));
    uVar5 = uVar4;
    for (uVar3 = 0x80000001; uVar3 <= uVar4 && uVar3 < 0x80000100; uVar3 = uVar3 + 1) {
      AddCPUID((CSHA512 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_fffffffffffffff4,subleaf_00,(uint32_t *)CONCAT44(uVar4,uVar3),
               (uint32_t *)
               CONCAT17(uVar2,CONCAT16(uVar3 <= uVar4 && uVar3 < 0x80000100,
                                       in_stack_ffffffffffffffc0)),&local_18,
               (uint32_t *)CONCAT44(uVar5,in_stack_fffffffffffffff0));
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
    __stack_chk_fail();
  }
  in_stack_ffffffffffffffd4 = 0;
  in_stack_ffffffffffffffd0 = 0;
LAB_00214b19:
  if (0xff < in_stack_ffffffffffffffd0) goto LAB_00214be9;
  AddCPUID((CSHA512 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
           in_stack_fffffffffffffff4,subleaf_00,
           (uint32_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
           (uint32_t *)CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0))
           ,&local_18,(uint32_t *)CONCAT44(uVar4,in_stack_fffffffffffffff0));
  if (subleaf_00 == 4) {
    uVar5 = uVar4 & 0x1f;
  }
  else {
    if (subleaf_00 == 7) {
      if (in_stack_ffffffffffffffd0 == 0) {
        in_stack_ffffffffffffffd4 = uVar4;
      }
      if (in_stack_ffffffffffffffd0 == in_stack_ffffffffffffffd4) goto LAB_00214be9;
      goto LAB_00214bd7;
    }
    if (subleaf_00 == 0xb) {
      uVar5 = local_14 & 0xff00;
      goto joined_r0x00214bc9;
    }
    if (subleaf_00 != 0xd) goto LAB_00214be9;
    if (((uVar4 != 0) || (in_stack_fffffffffffffff0 != 0)) || (uVar5 = local_18, local_14 != 0))
    goto LAB_00214bd7;
  }
joined_r0x00214bc9:
  if (uVar5 == 0) goto LAB_00214be9;
LAB_00214bd7:
  in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + 1;
  goto LAB_00214b19;
LAB_00214be9:
  subleaf_00 = subleaf_00 + 1;
  goto LAB_00214add;
}

Assistant:

void AddAllCPUID(CSHA512& hasher)
{
    uint32_t ax, bx, cx, dx;
    // Iterate over all standard leaves
    AddCPUID(hasher, 0, 0, ax, bx, cx, dx); // Returns max leaf in ax
    uint32_t max = ax;
    for (uint32_t leaf = 1; leaf <= max && leaf <= 0xFF; ++leaf) {
        uint32_t maxsub = 0;
        for (uint32_t subleaf = 0; subleaf <= 0xFF; ++subleaf) {
            AddCPUID(hasher, leaf, subleaf, ax, bx, cx, dx);
            // Iterate subleafs for leaf values 4, 7, 11, 13
            if (leaf == 4) {
                if ((ax & 0x1f) == 0) break;
            } else if (leaf == 7) {
                if (subleaf == 0) maxsub = ax;
                if (subleaf == maxsub) break;
            } else if (leaf == 11) {
                if ((cx & 0xff00) == 0) break;
            } else if (leaf == 13) {
                if (ax == 0 && bx == 0 && cx == 0 && dx == 0) break;
            } else {
                // For any other leaf, stop after subleaf 0.
                break;
            }
        }
    }
    // Iterate over all extended leaves
    AddCPUID(hasher, 0x80000000, 0, ax, bx, cx, dx); // Returns max extended leaf in ax
    uint32_t ext_max = ax;
    for (uint32_t leaf = 0x80000001; leaf <= ext_max && leaf <= 0x800000FF; ++leaf) {
        AddCPUID(hasher, leaf, 0, ax, bx, cx, dx);
    }
}